

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.hh
# Opt level: O2

void __thiscall
dtc::text_input_buffer::source_location::source_location
          (source_location *this,text_input_buffer *buf)

{
  shared_ptr<dtc::input_buffer> *this_00;
  element_type *peVar1;
  int iVar2;
  _Elt_pointer psVar3;
  
  this->buffer = buf;
  this_00 = &this->b;
  psVar3 = (buf->input_stack).c.
           super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar3 == (buf->input_stack).c.
                super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    (this_00->super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)0x0;
    (this->b).super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (psVar3 == (buf->input_stack).c.
                  super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      psVar3 = (buf->input_stack).c.
               super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    std::__shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&this_00->super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>,
               &psVar3[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>);
    peVar1 = (this_00->super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar1 != (element_type *)0x0) {
      iVar2 = peVar1->cursor;
      goto LAB_00133cfd;
    }
  }
  iVar2 = 0;
LAB_00133cfd:
  this->cursor = iVar2;
  return;
}

Assistant:

source_location(text_input_buffer &buf)
			: buffer(buf),
			  b(buf.input_stack.empty() ? nullptr : buf.input_stack.top()),
			  cursor(b ? b->cursor : 0) {}